

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O0

void __thiscall
leveldb::CorruptionTest::Check(CorruptionTest *this,int min_expected,int max_expected)

{
  DB *pDVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  Slice SVar7;
  bool local_119;
  AssertHelper local_108;
  Message local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  Slice local_b0;
  Slice local_a0;
  Slice local_90;
  undefined1 local_80 [8];
  Slice in;
  uint64_t key;
  long *local_58;
  Iterator *iter;
  string value_space;
  int local_28;
  int correct;
  int bad_values;
  int bad_keys;
  int missed;
  int next_expected;
  int max_expected_local;
  int min_expected_local;
  CorruptionTest *this_local;
  
  bad_keys = 0;
  bad_values = 0;
  correct = 0;
  local_28 = 0;
  value_space.field_2._12_4_ = 0;
  missed = max_expected;
  next_expected = min_expected;
  _max_expected_local = this;
  std::__cxx11::string::string((string *)&iter);
  pDVar1 = this->db_;
  memset(&key,0,0x10);
  ReadOptions::ReadOptions((ReadOptions *)&key);
  iVar3 = (*pDVar1->_vptr_DB[6])(pDVar1,&key);
  local_58 = (long *)CONCAT44(extraout_var,iVar3);
  (**(code **)(*local_58 + 0x18))();
  do {
    uVar4 = (**(code **)(*local_58 + 0x10))();
    if ((uVar4 & 1) == 0) {
      if (local_58 != (long *)0x0) {
        (**(code **)(*local_58 + 8))();
      }
      fprintf(_stderr,"expected=%d..%d; got=%d; bad_keys=%d; bad_values=%d; missed=%d\n",
              (ulong)(uint)next_expected,(ulong)(uint)missed,(ulong)(uint)value_space.field_2._12_4_
              ,(ulong)(uint)correct,local_28,bad_values);
      testing::internal::CmpHelperLE<int,int>
                ((internal *)local_d0,"min_expected","correct",&next_expected,
                 (int *)(value_space.field_2._M_local_buf + 0xc));
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar2) {
        testing::Message::Message(&local_d8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/corruption_test.cc"
                   ,0x6d,pcVar5);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        testing::Message::~Message(&local_d8);
      }
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        testing::internal::CmpHelperGE<int,int>
                  ((internal *)local_f8,"max_expected","correct",&missed,
                   (int *)(value_space.field_2._M_local_buf + 0xc));
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
        if (!bVar2) {
          testing::Message::Message(&local_100);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
          testing::internal::AssertHelper::AssertHelper
                    (&local_108,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/corruption_test.cc"
                     ,0x6e,pcVar5);
          testing::internal::AssertHelper::operator=(&local_108,&local_100);
          testing::internal::AssertHelper::~AssertHelper(&local_108);
          testing::Message::~Message(&local_100);
        }
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
        if (gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ = 0;
        }
      }
      std::__cxx11::string::~string((string *)&iter);
      return;
    }
    auVar6 = (**(code **)(*local_58 + 0x40))();
    in.data_ = auVar6._8_8_;
    local_80 = auVar6._0_8_;
    Slice::Slice(&local_90,"");
    bVar2 = leveldb::operator==((Slice *)local_80,&local_90);
    local_119 = true;
    if (!bVar2) {
      Slice::Slice(&local_a0,"~");
      local_119 = leveldb::operator==((Slice *)local_80,&local_a0);
    }
    if (local_119 == false) {
      bVar2 = ConsumeDecimalNumber((Slice *)local_80,&in.size_);
      if (bVar2) {
        bVar2 = Slice::empty((Slice *)local_80);
        if ((bVar2) && ((ulong)(long)bad_keys <= in.size_)) {
          bad_values = bad_values + ((int)in.size_ - bad_keys);
          bad_keys = (int)in.size_ + 1;
          SVar7 = (Slice)(**(code **)(*local_58 + 0x48))();
          local_b0 = SVar7;
          join_0x00000010_0x00000000_ = Value(this,(int)in.size_,(string *)&iter);
          bVar2 = leveldb::operator!=(&local_b0,(Slice *)&gtest_ar.message_);
          if (bVar2) {
            local_28 = local_28 + 1;
          }
          else {
            value_space.field_2._12_4_ = value_space.field_2._12_4_ + 1;
          }
          goto LAB_00111592;
        }
      }
      correct = correct + 1;
    }
LAB_00111592:
    (**(code **)(*local_58 + 0x30))();
  } while( true );
}

Assistant:

void Check(int min_expected, int max_expected) {
    int next_expected = 0;
    int missed = 0;
    int bad_keys = 0;
    int bad_values = 0;
    int correct = 0;
    std::string value_space;
    Iterator* iter = db_->NewIterator(ReadOptions());
    for (iter->SeekToFirst(); iter->Valid(); iter->Next()) {
      uint64_t key;
      Slice in(iter->key());
      if (in == "" || in == "~") {
        // Ignore boundary keys.
        continue;
      }
      if (!ConsumeDecimalNumber(&in, &key) || !in.empty() ||
          key < next_expected) {
        bad_keys++;
        continue;
      }
      missed += (key - next_expected);
      next_expected = key + 1;
      if (iter->value() != Value(key, &value_space)) {
        bad_values++;
      } else {
        correct++;
      }
    }
    delete iter;

    std::fprintf(
        stderr,
        "expected=%d..%d; got=%d; bad_keys=%d; bad_values=%d; missed=%d\n",
        min_expected, max_expected, correct, bad_keys, bad_values, missed);
    ASSERT_LE(min_expected, correct);
    ASSERT_GE(max_expected, correct);
  }